

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range_map_test.cc
# Opt level: O0

void __thiscall
bloaty::RangeMapTest_Translation2_Test::TestBody(RangeMapTest_Translation2_Test *this)

{
  initializer_list<bloaty::RangeMapTest::Entry> __l;
  initializer_list<bloaty::RangeMapTest::Entry> __l_00;
  initializer_list<bloaty::RangeMapTest::Entry> __l_01;
  bool bVar1;
  bool *success;
  long in_RDI;
  AssertionResult gtest_ar_;
  string *in_stack_fffffffffffffa48;
  RangeMapTest *in_stack_fffffffffffffa50;
  uint64_t in_stack_fffffffffffffa58;
  RangeMap *in_stack_fffffffffffffa60;
  int in_stack_fffffffffffffa6c;
  char *in_stack_fffffffffffffa70;
  undefined4 in_stack_fffffffffffffa78;
  Type in_stack_fffffffffffffa7c;
  allocator<char> *in_stack_fffffffffffffa80;
  iterator in_stack_fffffffffffffa88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa90;
  undefined1 in_stack_fffffffffffffa9f;
  RangeMap *in_stack_fffffffffffffaa0;
  string *in_stack_fffffffffffffaa8;
  undefined8 ***pppuVar2;
  char *in_stack_fffffffffffffab0;
  undefined8 ***pppuVar3;
  char *in_stack_fffffffffffffab8;
  RangeMap *in_stack_fffffffffffffac0;
  AssertionResult *in_stack_fffffffffffffac8;
  RangeMap *in_stack_fffffffffffffad0;
  undefined8 **local_500;
  undefined8 **local_468;
  allocator<char> local_3ca;
  allocator<char> local_3c9;
  undefined8 **local_3c8;
  undefined8 *local_3c0;
  undefined8 local_3b8;
  undefined8 local_3b0;
  vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_>
  *in_stack_fffffffffffffc60;
  RangeMap *in_stack_fffffffffffffc68;
  RangeMapTest *in_stack_fffffffffffffc70;
  undefined8 local_388;
  string *in_stack_fffffffffffffc80;
  uint64_t in_stack_fffffffffffffc88;
  uint64_t in_stack_fffffffffffffc90;
  uint64_t in_stack_fffffffffffffc98;
  RangeMap *in_stack_fffffffffffffca0;
  undefined8 **local_350;
  undefined8 local_348;
  undefined1 local_324;
  allocator<char> local_323;
  allocator<char> local_322;
  allocator<char> local_321;
  undefined8 **local_320;
  undefined8 *local_318;
  undefined8 local_310;
  undefined8 local_308;
  undefined8 local_2e0;
  undefined8 local_2d8;
  undefined8 local_2d0;
  undefined8 local_2a8;
  undefined8 local_2a0;
  undefined8 local_298;
  undefined8 **local_270;
  undefined8 local_268;
  uint local_244;
  string local_240 [55];
  allocator<char> local_209;
  string local_208 [39];
  undefined1 local_1e1;
  AssertionResult local_1e0;
  undefined1 local_1cd;
  allocator<char> local_1cc;
  allocator<char> local_1cb;
  allocator<char> local_1ca;
  allocator<char> local_1c9;
  undefined8 **local_1c8;
  undefined8 *local_1c0;
  undefined8 local_1b8;
  undefined8 local_1b0;
  undefined8 local_188;
  undefined8 local_180;
  undefined8 local_178;
  undefined8 local_150;
  undefined8 local_148;
  undefined8 local_140;
  undefined8 local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 **local_e0;
  undefined8 local_d8;
  allocator<char> local_b1;
  string local_b0 [39];
  allocator<char> local_89;
  string local_88 [39];
  allocator<char> local_61;
  string local_60 [55];
  allocator<char> local_29;
  string local_28 [40];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa90,(char *)in_stack_fffffffffffffa88,in_stack_fffffffffffffa80);
  RangeMap::AddRange(in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,
                     (uint64_t)in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator(&local_29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa90,(char *)in_stack_fffffffffffffa88,in_stack_fffffffffffffa80);
  RangeMap::AddDualRange
            (in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,in_stack_fffffffffffffc90,
             in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator(&local_61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa90,(char *)in_stack_fffffffffffffa88,in_stack_fffffffffffffa80);
  RangeMap::AddRange(in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,
                     (uint64_t)in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator(&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa90,(char *)in_stack_fffffffffffffa88,in_stack_fffffffffffffa80);
  RangeMap::AddDualRange
            (in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,in_stack_fffffffffffffc90,
             in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator(&local_b1);
  RangeMapTest::CheckConsistency(in_stack_fffffffffffffa50);
  local_1cd = 1;
  local_1c8 = &local_1c0;
  local_1c0 = (undefined8 **)0x5;
  local_1b8 = 10;
  local_1b0 = *(undefined8 *)(in_RDI + 0xa0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa90,(char *)in_stack_fffffffffffffa88,in_stack_fffffffffffffa80);
  local_1c8 = (undefined8 **)&local_188;
  local_188 = 0x14;
  local_180 = 0x19;
  local_178 = 0x78;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa90,(char *)in_stack_fffffffffffffa88,in_stack_fffffffffffffa80);
  local_1c8 = (undefined8 **)&local_150;
  local_150 = 0x19;
  local_148 = 0x1e;
  local_140 = *(undefined8 *)(in_RDI + 0xa0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa90,(char *)in_stack_fffffffffffffa88,in_stack_fffffffffffffa80);
  local_1c8 = (undefined8 **)&local_118;
  local_118 = 0x1e;
  local_110 = 0x23;
  local_108 = 0x82;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa90,(char *)in_stack_fffffffffffffa88,in_stack_fffffffffffffa80);
  local_1cd = 0;
  local_e0 = &local_1c0;
  local_d8 = 4;
  std::allocator<bloaty::RangeMapTest::Entry>::allocator
            ((allocator<bloaty::RangeMapTest::Entry> *)0x17f4e7);
  __l._M_len = (size_type)in_stack_fffffffffffffa90;
  __l._M_array = in_stack_fffffffffffffa88;
  std::vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_>::vector
            ((vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_> *)
             in_stack_fffffffffffffa80,__l,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
  RangeMapTest::AssertMainMapEquals
            (in_stack_fffffffffffffa50,
             (vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_> *)
             in_stack_fffffffffffffa48);
  std::vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_>::~vector
            ((vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_> *)
             in_stack_fffffffffffffa60);
  std::allocator<bloaty::RangeMapTest::Entry>::~allocator
            ((allocator<bloaty::RangeMapTest::Entry> *)0x17f53f);
  local_468 = &local_e0;
  do {
    local_468 = local_468 + -7;
    RangeMapTest::Entry::~Entry((Entry *)0x17f576);
  } while (local_468 != &local_1c0);
  std::allocator<char>::~allocator(&local_1cc);
  std::allocator<char>::~allocator(&local_1cb);
  std::allocator<char>::~allocator(&local_1ca);
  std::allocator<char>::~allocator(&local_1c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa90,(char *)in_stack_fffffffffffffa88,in_stack_fffffffffffffa80);
  success = (bool *)(in_RDI + 0x70);
  local_1e1 = RangeMap::AddRangeWithTranslation
                        (in_stack_fffffffffffffac0,(uint64_t)in_stack_fffffffffffffab8,
                         (uint64_t)in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8,
                         in_stack_fffffffffffffaa0,(bool)in_stack_fffffffffffffa9f,
                         in_stack_fffffffffffffad0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffffa50,success,(type *)0x17f67b);
  std::__cxx11::string::~string(local_208);
  std::allocator<char>::~allocator(&local_209);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1e0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffa80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffac8,(char *)in_stack_fffffffffffffac0,in_stack_fffffffffffffab8
               ,in_stack_fffffffffffffab0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa7c,
               in_stack_fffffffffffffa70,in_stack_fffffffffffffa6c,(char *)in_stack_fffffffffffffa60
              );
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffad0,(Message *)in_stack_fffffffffffffac8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffa50);
    std::__cxx11::string::~string(local_240);
    testing::Message::~Message((Message *)0x17fa89);
  }
  local_244 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x17fb1a);
  if (local_244 == 0) {
    RangeMapTest::CheckConsistency(in_stack_fffffffffffffa50);
    local_324 = 1;
    local_320 = &local_318;
    local_318 = (undefined8 **)0x14;
    local_310 = 0x19;
    local_308 = *(undefined8 *)(in_RDI + 0xa0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffa90,(char *)in_stack_fffffffffffffa88,in_stack_fffffffffffffa80
              );
    local_320 = (undefined8 **)&local_2e0;
    local_2e0 = 0x19;
    local_2d8 = 0x1e;
    local_2d0 = *(undefined8 *)(in_RDI + 0xa0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffa90,(char *)in_stack_fffffffffffffa88,in_stack_fffffffffffffa80
              );
    local_320 = (undefined8 **)&local_2a8;
    local_2a8 = 0x1e;
    local_2a0 = 0x23;
    local_298 = *(undefined8 *)(in_RDI + 0xa0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffa90,(char *)in_stack_fffffffffffffa88,in_stack_fffffffffffffa80
              );
    local_324 = 0;
    local_270 = &local_318;
    local_268 = 3;
    std::allocator<bloaty::RangeMapTest::Entry>::allocator
              ((allocator<bloaty::RangeMapTest::Entry> *)0x17fd0f);
    __l_00._M_len = (size_type)in_stack_fffffffffffffa90;
    __l_00._M_array = in_stack_fffffffffffffa88;
    std::vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_>::vector
              ((vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_> *)
               in_stack_fffffffffffffa80,__l_00,
               (allocator_type *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
    RangeMapTest::AssertMapEquals
              (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,in_stack_fffffffffffffc60);
    std::vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_>::~vector
              ((vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_> *)
               in_stack_fffffffffffffa60);
    std::allocator<bloaty::RangeMapTest::Entry>::~allocator
              ((allocator<bloaty::RangeMapTest::Entry> *)0x17fd6f);
    local_500 = &local_270;
    do {
      local_500 = local_500 + -7;
      RangeMapTest::Entry::~Entry((Entry *)0x17fda6);
    } while (local_500 != &local_318);
    std::allocator<char>::~allocator(&local_323);
    std::allocator<char>::~allocator(&local_322);
    std::allocator<char>::~allocator(&local_321);
    local_3c8 = &local_3c0;
    local_3c0 = (undefined8 **)0x78;
    local_3b8 = 0x7d;
    local_3b0 = *(undefined8 *)(in_RDI + 0xa0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffa90,(char *)in_stack_fffffffffffffa88,in_stack_fffffffffffffa80
              );
    local_3c8 = (undefined8 **)&local_388;
    local_388 = 0x82;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffa90,(char *)in_stack_fffffffffffffa88,in_stack_fffffffffffffa80
              );
    local_350 = &local_3c0;
    local_348 = 2;
    std::allocator<bloaty::RangeMapTest::Entry>::allocator
              ((allocator<bloaty::RangeMapTest::Entry> *)0x17ff3b);
    __l_01._M_len = (size_type)in_stack_fffffffffffffa90;
    __l_01._M_array = in_stack_fffffffffffffa88;
    std::vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_>::vector
              ((vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_> *)
               in_stack_fffffffffffffa80,__l_01,
               (allocator_type *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
    RangeMapTest::AssertMapEquals
              (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,in_stack_fffffffffffffc60);
    std::vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_>::~vector
              ((vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_> *)
               in_stack_fffffffffffffa60);
    std::allocator<bloaty::RangeMapTest::Entry>::~allocator
              ((allocator<bloaty::RangeMapTest::Entry> *)0x17ff98);
    pppuVar3 = (undefined8 ***)&local_3c0;
    pppuVar2 = &local_350;
    do {
      pppuVar2 = pppuVar2 + -7;
      RangeMapTest::Entry::~Entry((Entry *)0x17ffc1);
    } while (pppuVar2 != pppuVar3);
    std::allocator<char>::~allocator(&local_3ca);
    std::allocator<char>::~allocator(&local_3c9);
  }
  return;
}

Assistant:

TEST_F(RangeMapTest, Translation2) {
  map_.AddRange(5, 5, "foo");
  map_.AddDualRange(20, 5, 120, "bar");
  map_.AddRange(25, 5, "baz");
  map_.AddDualRange(30, 5, 130, "quux");
  CheckConsistency();
  AssertMainMapEquals({
    {5, 10, kNoTranslation, "foo"},
    {20, 25, 120, "bar"},
    {25, 30, kNoTranslation, "baz"},
    {30, 35, 130, "quux"}
  });

  ASSERT_TRUE(map2_.AddRangeWithTranslation(20, 15, "translate me", map_, false,
                                            &map3_));
  CheckConsistency();
  AssertMapEquals(map2_, {
    {20, 25, kNoTranslation, "translate me"},
    {25, 30, kNoTranslation, "translate me"},
    {30, 35, kNoTranslation, "translate me"}
  });
  AssertMapEquals(map3_, {
    {120, 125, kNoTranslation, "translate me"},
    {130, 135, kNoTranslation, "translate me"}
  });
}